

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O2

void __thiscall StatAggregator::~StatAggregator(StatAggregator *this)

{
  StatMatrix_t ppsVar1;
  stat_history_t *psVar2;
  pointer puVar3;
  long lVar4;
  int i;
  long lVar5;
  
  for (lVar5 = 0; ppsVar1 = this->t_stats, lVar5 < this->num_stats; lVar5 = lVar5 + 1) {
    psVar2 = ppsVar1[lVar5];
    if (psVar2 != (stat_history_t *)0x0) {
      puVar3 = psVar2[-1].latencies.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (puVar3 != (pointer)0x0) {
        lVar4 = (long)puVar3 * 0x38;
        do {
          stat_history_t::~stat_history_t((void *)((long)&psVar2[-1].name._M_dataplus._M_p + lVar4))
          ;
          lVar4 = lVar4 + -0x38;
        } while (lVar4 != 0);
      }
      operator_delete__(&psVar2[-1].latencies.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    }
  }
  if (ppsVar1 != (StatMatrix_t)0x0) {
    operator_delete__(ppsVar1);
    return;
  }
  return;
}

Assistant:

StatAggregator::~StatAggregator() {

    for (int i = 0; i < num_stats; ++i) {
        delete[] t_stats[i];
    }
    delete[] t_stats;
}